

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UnicodeString::extract
          (UnicodeString *this,int32_t start,int32_t length,char *target,int32_t targetCapacity,
          EInvariant param_5)

{
  int32_t iVar1;
  char16_t *pcVar2;
  UErrorCode status;
  int local_2c;
  int local_28;
  UErrorCode local_24;
  
  iVar1 = 0;
  if ((-1 < targetCapacity) && (iVar1 = 0, target != (char *)0x0 || targetCapacity == 0)) {
    local_2c = length;
    local_28 = start;
    pinIndices(this,&local_28,&local_2c);
    if (local_2c <= targetCapacity) {
      if (((this->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
        pcVar2 = (this->fUnion).fFields.fArray;
      }
      else {
        pcVar2 = (char16_t *)((long)&this->fUnion + 2);
      }
      u_UCharsToChars_63(pcVar2 + local_28,target,local_2c);
    }
    local_24 = U_ZERO_ERROR;
    iVar1 = u_terminateChars_63(target,targetCapacity,local_2c,&local_24);
  }
  return iVar1;
}

Assistant:

int32_t
UnicodeString::extract(int32_t start,
                       int32_t length,
                       char *target,
                       int32_t targetCapacity,
                       enum EInvariant) const
{
  // if the arguments are illegal, then do nothing
  if(targetCapacity < 0 || (targetCapacity > 0 && target == NULL)) {
    return 0;
  }

  // pin the indices to legal values
  pinIndices(start, length);

  if(length <= targetCapacity) {
    u_UCharsToChars(getArrayStart() + start, target, length);
  }
  UErrorCode status = U_ZERO_ERROR;
  return u_terminateChars(target, targetCapacity, length, &status);
}